

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O1

string * __thiscall
cmLocalGenerator::GetObjectFileNameWithoutTarget
          (string *__return_storage_ptr__,cmLocalGenerator *this,cmSourceFile *source,
          string *dir_max,bool *hasSourceExtension,char *customOutputExtension)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  cmLocalGenerator *this_00;
  bool *pbVar3;
  bool bVar4;
  string *psVar5;
  char *pcVar6;
  long lVar7;
  string *psVar8;
  byte bVar9;
  bool bVar10;
  string lang;
  string relFromBinary;
  string objectName;
  string repVar;
  string relFromSource;
  string local_108;
  cmSourceFile *local_e8;
  string local_e0;
  undefined1 local_c0 [16];
  undefined1 local_b0 [32];
  string local_90;
  string local_70;
  string *local_50;
  string *local_48;
  cmLocalGenerator *local_40;
  bool *local_38;
  
  local_e8 = source;
  local_b0._24_8_ = customOutputExtension;
  local_50 = dir_max;
  local_48 = __return_storage_ptr__;
  psVar5 = cmSourceFile::GetFullPath_abi_cxx11_(source);
  cmStateSnapshot::GetDirectory((cmStateDirectory *)local_c0,&this->StateSnapshot);
  pcVar6 = cmStateDirectory::GetCurrentSource((cmStateDirectory *)local_c0);
  std::__cxx11::string::string((string *)&local_e0,pcVar6,(allocator *)local_c0);
  cmOutputConverter::ConvertToRelativePath
            (&local_70,&this->super_cmOutputConverter,&local_e0,psVar5);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
    operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
  }
  local_38 = hasSourceExtension;
  if (local_70._M_string_length == 0) {
    __assert_fail("!relFromSource.empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/cmLocalGenerator.cxx"
                  ,0x932,
                  "std::string cmLocalGenerator::GetObjectFileNameWithoutTarget(const cmSourceFile &, const std::string &, bool *, const char *)"
                 );
  }
  cmsys::SystemTools::FileIsFullPath(local_70._M_dataplus._M_p);
  local_40 = this;
  cmStateSnapshot::GetDirectory((cmStateDirectory *)local_c0,&this->StateSnapshot);
  pcVar6 = cmStateDirectory::GetCurrentBinary((cmStateDirectory *)local_c0);
  std::__cxx11::string::string((string *)&local_108,pcVar6,(allocator *)local_c0);
  cmOutputConverter::ConvertToRelativePath
            (&local_e0,&this->super_cmOutputConverter,&local_108,psVar5);
  paVar1 = &local_108.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108._M_dataplus._M_p != paVar1) {
    operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
  }
  if (local_e0._M_string_length != 0) {
    cmsys::SystemTools::FileIsFullPath(local_e0._M_dataplus._M_p);
    local_c0._8_8_ = 0;
    local_b0[0] = '\0';
    local_c0._0_8_ = (cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)local_b0;
    std::__cxx11::string::_M_assign((string *)local_c0);
    pbVar3 = local_38;
    this_00 = local_40;
    bVar4 = cmsys::SystemTools::FileIsFullPath((char *)local_c0._0_8_);
    if ((bVar4) &&
       (bVar4 = cmake::GetIsInTryCompile(this_00->GlobalGenerator->CMakeInstance), bVar4)) {
      psVar5 = cmSourceFile::GetFullPath_abi_cxx11_(local_e8);
      cmsys::SystemTools::GetFilenameName(&local_108,psVar5);
      std::__cxx11::string::operator=((string *)local_c0,(string *)&local_108);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_108._M_dataplus._M_p != paVar1) {
        operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
      }
    }
    local_108._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"KEEP_EXTENSION","");
    bVar4 = cmSourceFile::GetPropertyAsBool(local_e8,&local_108);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != paVar1) {
      operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
    }
    bVar10 = true;
    if (!bVar4) {
      bVar4 = NeedBackwardsCompatibility_2_4(this_00);
      if (!bVar4) {
        cmSourceFile::GetLanguage_abi_cxx11_(&local_108,local_e8);
        if (local_108._M_string_length != 0) {
          local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)(local_b0 + 0x20),"CMAKE_","");
          std::__cxx11::string::_M_append(local_b0 + 0x20,(ulong)local_108._M_dataplus._M_p);
          std::__cxx11::string::append(local_b0 + 0x20);
          bVar4 = cmMakefile::IsOn(this_00->Makefile,(string *)(local_b0 + 0x20));
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_90._M_dataplus._M_p != &local_90.field_2) {
            operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_108._M_dataplus._M_p != paVar1) {
          operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
        }
      }
      bVar9 = (pointer)local_b0._24_8_ != (pointer)0x0 | bVar4;
      if ((bVar9 == 1) && (lVar7 = std::__cxx11::string::rfind((char)local_c0,0x2e), lVar7 != -1)) {
        std::__cxx11::string::substr((ulong)&local_108,(ulong)local_c0);
        std::__cxx11::string::operator=((string *)local_c0,(string *)&local_108);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_108._M_dataplus._M_p != paVar1) {
          operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
        }
      }
      if ((pointer)local_b0._24_8_ == (pointer)0x0) {
        cmGlobalGenerator::GetLanguageOutputExtension_abi_cxx11_
                  (&local_108,this_00->GlobalGenerator,local_e8);
        std::__cxx11::string::_M_append(local_c0,(ulong)local_108._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_108._M_dataplus._M_p != paVar1) {
          operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
        }
      }
      else {
        std::__cxx11::string::append(local_c0);
      }
      bVar10 = (bool)(bVar9 ^ 1);
    }
    if (pbVar3 != (bool *)0x0) {
      *pbVar3 = bVar10;
    }
    psVar8 = CreateSafeUniqueObjectFileName(this_00,(string *)local_c0,local_50);
    psVar5 = local_48;
    (local_48->_M_dataplus)._M_p = (pointer)&local_48->field_2;
    pcVar2 = (psVar8->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_48,pcVar2,pcVar2 + psVar8->_M_string_length);
    if ((cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)local_c0._0_8_ !=
        (cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)local_b0) {
      operator_delete((void *)local_c0._0_8_,CONCAT71(local_b0._1_7_,local_b0[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
      operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
    return psVar5;
  }
  __assert_fail("!relFromBinary.empty()",
                "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/cmLocalGenerator.cxx"
                ,0x939,
                "std::string cmLocalGenerator::GetObjectFileNameWithoutTarget(const cmSourceFile &, const std::string &, bool *, const char *)"
               );
}

Assistant:

std::string cmLocalGenerator::GetObjectFileNameWithoutTarget(
  const cmSourceFile& source, std::string const& dir_max,
  bool* hasSourceExtension, char const* customOutputExtension)
{
  // Construct the object file name using the full path to the source
  // file which is its only unique identification.
  std::string const& fullPath = source.GetFullPath();

  // Try referencing the source relative to the source tree.
  std::string relFromSource =
    this->ConvertToRelativePath(this->GetCurrentSourceDirectory(), fullPath);
  assert(!relFromSource.empty());
  bool relSource = !cmSystemTools::FileIsFullPath(relFromSource.c_str());
  bool subSource = relSource && relFromSource[0] != '.';

  // Try referencing the source relative to the binary tree.
  std::string relFromBinary =
    this->ConvertToRelativePath(this->GetCurrentBinaryDirectory(), fullPath);
  assert(!relFromBinary.empty());
  bool relBinary = !cmSystemTools::FileIsFullPath(relFromBinary.c_str());
  bool subBinary = relBinary && relFromBinary[0] != '.';

  // Select a nice-looking reference to the source file to construct
  // the object file name.
  std::string objectName;
  if ((relSource && !relBinary) || (subSource && !subBinary)) {
    objectName = relFromSource;
  } else if ((relBinary && !relSource) || (subBinary && !subSource)) {
    objectName = relFromBinary;
  } else if (relFromBinary.length() < relFromSource.length()) {
    objectName = relFromBinary;
  } else {
    objectName = relFromSource;
  }

  // if it is still a full path check for the try compile case
  // try compile never have in source sources, and should not
  // have conflicting source file names in the same target
  if (cmSystemTools::FileIsFullPath(objectName.c_str())) {
    if (this->GetGlobalGenerator()->GetCMakeInstance()->GetIsInTryCompile()) {
      objectName = cmSystemTools::GetFilenameName(source.GetFullPath());
    }
  }

  // Replace the original source file extension with the object file
  // extension.
  bool keptSourceExtension = true;
  if (!source.GetPropertyAsBool("KEEP_EXTENSION")) {
    // Decide whether this language wants to replace the source
    // extension with the object extension.  For CMake 2.4
    // compatibility do this by default.
    bool replaceExt = this->NeedBackwardsCompatibility_2_4();
    if (!replaceExt) {
      std::string lang = source.GetLanguage();
      if (!lang.empty()) {
        std::string repVar = "CMAKE_";
        repVar += lang;
        repVar += "_OUTPUT_EXTENSION_REPLACE";
        replaceExt = this->Makefile->IsOn(repVar);
      }
    }

    // Remove the source extension if it is to be replaced.
    if (replaceExt || customOutputExtension) {
      keptSourceExtension = false;
      std::string::size_type dot_pos = objectName.rfind('.');
      if (dot_pos != std::string::npos) {
        objectName = objectName.substr(0, dot_pos);
      }
    }

    // Store the new extension.
    if (customOutputExtension) {
      objectName += customOutputExtension;
    } else {
      objectName += this->GlobalGenerator->GetLanguageOutputExtension(source);
    }
  }
  if (hasSourceExtension) {
    *hasSourceExtension = keptSourceExtension;
  }

  // Convert to a safe name.
  return this->CreateSafeUniqueObjectFileName(objectName, dir_max);
}